

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void open_func(LexState *ls,FuncState *fs,BlockCnt *bl)

{
  lua_State *L_00;
  Proto *pPVar1;
  StkId pTVar2;
  Table *pTVar3;
  TValue *io;
  Proto *f;
  lua_State *L;
  BlockCnt *bl_local;
  FuncState *fs_local;
  LexState *ls_local;
  
  L_00 = ls->L;
  fs->prev = ls->fs;
  fs->ls = ls;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = 0;
  fs->jpc = -1;
  fs->freereg = '\0';
  fs->nk = 0;
  fs->np = 0;
  fs->nups = '\0';
  fs->nlocvars = 0;
  fs->nactvar = '\0';
  fs->firstlocal = (ls->dyd->actvar).n;
  fs->bl = (BlockCnt *)0x0;
  pPVar1 = fs->f;
  pPVar1->source = ls->source;
  pPVar1->maxstacksize = '\x02';
  pTVar3 = luaH_new(L_00);
  fs->h = pTVar3;
  pTVar2 = L_00->top;
  pTVar2->value_ = (Value)fs->h;
  pTVar2->tt_ = 0x45;
  L_00->top = L_00->top + 1;
  if ((long)L_00->stack_last - (long)L_00->top >> 4 < 1) {
    luaD_growstack(L_00,0);
  }
  enterblock(fs,bl,'\0');
  return;
}

Assistant:

static void open_func (LexState *ls, FuncState *fs, BlockCnt *bl) {
  lua_State *L = ls->L;
  Proto *f;
  fs->prev = ls->fs;  /* linked list of funcstates */
  fs->ls = ls;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = 0;
  fs->jpc = NO_JUMP;
  fs->freereg = 0;
  fs->nk = 0;
  fs->np = 0;
  fs->nups = 0;
  fs->nlocvars = 0;
  fs->nactvar = 0;
  fs->firstlocal = ls->dyd->actvar.n;
  fs->bl = NULL;
  f = fs->f;
  f->source = ls->source;
  f->maxstacksize = 2;  /* registers 0/1 are always valid */
  fs->h = luaH_new(L);
  /* anchor table of constants (to avoid being collected) */
  sethvalue2s(L, L->top, fs->h);
  incr_top(L);
  enterblock(fs, bl, 0);
}